

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_vacuum.cpp
# Opt level: O1

void __thiscall
duckdb::Binder::BindVacuumTable
          (Binder *this,LogicalVacuum *vacuum,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *root)

{
  TableCatalogEntry *table_p;
  pointer pbVar1;
  pointer pcVar2;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var3;
  _Alloc_hider _Var4;
  bool bVar5;
  type pVVar6;
  pointer pBVar7;
  pointer pBVar8;
  ColumnList *pCVar9;
  ColumnDefinition *pCVar10;
  const_iterator cVar11;
  type ref_00;
  pointer this_00;
  LogicalGet *this_01;
  vector<duckdb::ColumnIndex,_true> *this_02;
  const_reference pvVar12;
  PhysicalIndex PVar13;
  mapped_type *pmVar14;
  idx_t table_index;
  LogicalProjection *this_03;
  pointer pLVar15;
  BinderException *pBVar16;
  InvalidInputException *this_04;
  _Hash_node_base *p_Var17;
  pointer __k;
  size_t sVar18;
  ColumnListIterator CVar19;
  unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> bound_table;
  unique_ptr<duckdb::BoundBaseTableRef,_std::default_delete<duckdb::BoundBaseTableRef>,_true> ref;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  select_list;
  ColumnLogicalIteratorInternal __begin2;
  templated_unique_single_t projection;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> table_scan
  ;
  case_insensitive_set_t column_name_set;
  undefined1 local_258 [32];
  pointer local_238;
  __node_base _Stack_230;
  pointer local_228;
  _Hash_node_base *local_218;
  __node_base_ptr p_Stack_210;
  __buckets_ptr local_208;
  type local_200;
  undefined1 local_1f8 [8];
  undefined1 auStack_1f0 [24];
  _Hash_node_base local_1d8 [2];
  _Alloc_hider local_1c8;
  char local_1b8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1a8 [56];
  string local_170;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_150
  ;
  __node_base_ptr local_148;
  BindContext *local_140;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0 [24];
  string local_c8;
  undefined1 local_a8 [32];
  string local_88;
  undefined1 local_68 [40];
  __node_base local_40;
  element_type *peStack_38;
  
  local_258._16_8_ = vacuum;
  pVVar6 = unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>::operator*
                     (&vacuum->info);
  if (pVVar6->has_table == true) {
    local_150 = root;
    unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator*
              (&pVVar6->ref);
    local_258._8_8_ = this;
    Bind((Binder *)local_258,(TableRef *)this);
    pBVar7 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
             operator->((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                         *)local_258);
    local_258._24_8_ = local_258._0_8_;
    if (pBVar7->type != BASE_TABLE) {
      this_04 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_1f8 = (undefined1  [8])(auStack_1f0 + 8);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f8,"can only vacuum or analyze base tables","");
      InvalidInputException::InvalidInputException(this_04,(string *)local_1f8);
      __cxa_throw(this_04,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_258._0_8_ = (element_type *)0x0;
    pBVar8 = unique_ptr<duckdb::BoundBaseTableRef,_std::default_delete<duckdb::BoundBaseTableRef>,_true>
             ::operator->((unique_ptr<duckdb::BoundBaseTableRef,_std::default_delete<duckdb::BoundBaseTableRef>,_true>
                           *)(local_258 + 0x18));
    table_p = pBVar8->table;
    LogicalVacuum::SetTable((LogicalVacuum *)local_258._16_8_,table_p);
    local_218 = (_Hash_node_base *)0x0;
    p_Stack_210 = (__node_base_ptr)0x0;
    local_208 = (__buckets_ptr)0x0;
    local_200 = pVVar6;
    if ((pVVar6->columns).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pVVar6->columns).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pCVar9 = TableCatalogEntry::GetColumns(table_p);
      CVar19 = ColumnList::Physical(pCVar9);
      pCVar9 = CVar19.list;
      if (((undefined1  [16])CVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        auStack_1f0._16_8_ =
             ((long)(pCVar9->columns).
                    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    .
                    super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pCVar9->columns).
                    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    .
                    super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
      }
      else {
        auStack_1f0._16_8_ =
             (long)(pCVar9->physical_columns).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pCVar9->physical_columns).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
      }
      auStack_1f0[0] = CVar19.physical;
      auStack_1f0._8_8_ = (_Hash_node_base *)0x0;
      if (((undefined1  [16])CVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        p_Var17 = (_Hash_node_base *)
                  (((long)(pCVar9->columns).
                          super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          .
                          super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pCVar9->columns).
                          super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          .
                          super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed);
      }
      else {
        p_Var17 = (_Hash_node_base *)
                  ((long)(pCVar9->physical_columns).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pCVar9->physical_columns).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3);
      }
      if (((undefined1  [16])CVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        sVar18 = ((long)(pCVar9->columns).
                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        .
                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pCVar9->columns).
                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        .
                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
      }
      else {
        sVar18 = (long)(pCVar9->physical_columns).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pCVar9->physical_columns).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
      }
      local_1f8 = (undefined1  [8])pCVar9;
      if ((p_Var17 != (_Hash_node_base *)0x0) || (auStack_1f0._16_8_ != sVar18)) {
        do {
          pCVar10 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                              ((ColumnLogicalIteratorInternal *)local_1f8);
          ColumnDefinition::GetName_abi_cxx11_((string *)local_118,pCVar10);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &pVVar6->columns,(string *)local_118);
          if ((_Hash_node_base *)local_118._0_8_ != (_Hash_node_base *)(local_118 + 0x10)) {
            operator_delete((void *)local_118._0_8_);
          }
          auStack_1f0._8_8_ = auStack_1f0._8_8_ + 1;
        } while ((((_Hash_node_base *)auStack_1f0._8_8_ != p_Var17) ||
                 (auStack_1f0._16_8_ != sVar18)) || (local_1f8 != (undefined1  [8])pCVar9));
      }
    }
    local_68._0_8_ = &stack0xffffffffffffffc8;
    local_68._8_8_ = &DAT_00000001;
    local_68._16_8_ = (pointer)0x0;
    local_68._24_8_ = (pointer)0x0;
    local_68._32_4_ = 1.0;
    local_40._M_nxt = (_Hash_node_base *)0x0;
    peStack_38 = (element_type *)0x0;
    local_238 = (pointer)0x0;
    _Stack_230._M_nxt = (_Hash_node_base *)0x0;
    local_228 = (pointer)0x0;
    __k = (local_200->columns).
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (local_200->columns).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__k != pbVar1) {
      local_140 = (BindContext *)
                  &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_258._8_8_ + 0x80))->
                   _M_use_count;
      local_148 = (__node_base_ptr)&PTR__ColumnRefExpression_019aff90;
      do {
        cVar11 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)local_68,__k);
        if (cVar11.
            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
          local_1f8 = (undefined1  [8])(auStack_1f0 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1f8,
                     "cannot vacuum or analyze the same column twice, i.e., there is a duplicate entry in the list of column names"
                     ,"");
          BinderException::BinderException(pBVar16,(string *)local_1f8);
          __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_1f8 = (undefined1  [8])local_68;
        ::std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)local_68,__k,(BindResult *)local_1f8);
        bVar5 = TableCatalogEntry::ColumnExists(table_p,__k);
        if (!bVar5) {
          pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
          local_1f8 = (undefined1  [8])(auStack_1f0 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1f8,"Column with name \"%s\" does not exist","");
          local_a8._0_8_ = local_a8 + 0x10;
          pcVar2 = (__k->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_a8,pcVar2,pcVar2 + __k->_M_string_length);
          BinderException::BinderException<std::__cxx11::string>
                    (pBVar16,(string *)local_1f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
          __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pCVar10 = TableCatalogEntry::GetColumn(table_p,__k);
        bVar5 = ColumnDefinition::Generated(pCVar10);
        if (bVar5) {
          pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
          local_1f8 = (undefined1  [8])(auStack_1f0 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1f8,
                     "cannot vacuum or analyze generated column \"%s\" - specify non-generated columns to vacuum or analyze"
                     ,"");
          ColumnDefinition::GetName_abi_cxx11_(&local_88,pCVar10);
          BinderException::BinderException<std::__cxx11::string>
                    (pBVar16,(string *)local_1f8,&local_88);
          __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_238,__k);
        local_138._0_8_ = local_138 + 0x10;
        pcVar2 = (__k->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_138,pcVar2,pcVar2 + __k->_M_string_length);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        pcVar2 = (table_p->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name.
                 _M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,pcVar2,
                   pcVar2 + (table_p->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                            name._M_string_length);
        ColumnRefExpression::ColumnRefExpression
                  ((ColumnRefExpression *)local_118,(string *)local_138,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
        if ((pointer)local_138._0_8_ != (pointer)(local_138 + 0x10)) {
          operator_delete((void *)local_138._0_8_);
        }
        BindContext::BindColumn
                  ((BindResult *)local_1f8,local_140,(ColumnRefExpression *)local_118,0);
        if ((bool)auStack_1f0[0] == true) {
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_170,anon_var_dwarf_643533f + 9);
          ErrorData::Throw((ErrorData *)auStack_1f0,&local_170);
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_218,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_1f8);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(local_1a8);
        if (local_1c8._M_p != local_1b8) {
          operator_delete(local_1c8._M_p);
        }
        if ((_Hash_node_base *)auStack_1f0._8_8_ != local_1d8) {
          operator_delete((void *)auStack_1f0._8_8_);
        }
        if (local_1f8 != (undefined1  [8])0x0) {
          (*(code *)*(__node_base_ptr *)
                     ((long)&((((vector<duckdb::ColumnDefinition,_true> *)local_1f8)->
                              super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                              ).
                              super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                              ._M_impl.super__Vector_impl_data._M_start)->name + 8))();
        }
        local_118._0_8_ = local_148;
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_e0);
        local_118._0_8_ = &PTR__BaseExpression_01993200;
        if ((undefined1 *)local_118._16_8_ != local_f8) {
          operator_delete((void *)local_118._16_8_);
        }
        __k = __k + 1;
      } while (__k != pbVar1);
    }
    local_1f8 = (undefined1  [8])
                (local_200->columns).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    auStack_1f0._0_8_ =
         (local_200->columns).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_1f0._8_8_ =
         (local_200->columns).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (local_200->columns).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_238;
    (local_200->columns).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Stack_230._M_nxt;
    (local_200->columns).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_228;
    local_238 = (pointer)0x0;
    _Stack_230._M_nxt = (_Hash_node_base *)0x0;
    local_228 = (pointer)0x0;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1f8);
    ref_00 = unique_ptr<duckdb::BoundBaseTableRef,_std::default_delete<duckdb::BoundBaseTableRef>,_true>
             ::operator*((unique_ptr<duckdb::BoundBaseTableRef,_std::default_delete<duckdb::BoundBaseTableRef>,_true>
                          *)(local_258 + 0x18));
    CreatePlan((Binder *)local_258._8_8_,ref_00);
    this_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)local_118);
    this_01 = LogicalOperator::Cast<duckdb::LogicalGet>(this_00);
    this_02 = LogicalGet::GetColumnIds(this_01);
    local_1f8 = (undefined1  [8])0x0;
    if ((this_02->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this_02->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_258._16_8_ =
           &(((ClientConfig *)(local_258._16_8_ + 0x38))->profiler_save_location).field_2;
      do {
        pCVar9 = TableCatalogEntry::GetColumns(table_p);
        pvVar12 = vector<duckdb::ColumnIndex,_true>::operator[](this_02,(size_type)local_1f8);
        PVar13 = ColumnList::LogicalToPhysical(pCVar9,pvVar12->index);
        pmVar14 = ::std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)local_258._16_8_,(key_type *)local_1f8);
        *pmVar14 = PVar13.index;
        local_1f8 = (undefined1  [8])((long)(_Hash_node_base **)local_1f8 + 1);
      } while ((ulong)local_1f8 <
               (_Hash_node_base *)
               ((long)(this_02->
                      super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
                      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this_02->
                      super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
                      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 5));
    }
    table_index = GenerateTableIndex((Binder *)local_258._8_8_);
    this_03 = (LogicalProjection *)operator_new(0x70);
    local_1f8 = (undefined1  [8])local_218;
    auStack_1f0._0_8_ = p_Stack_210;
    auStack_1f0._8_8_ = local_208;
    local_218 = (_Hash_node_base *)0x0;
    p_Stack_210 = (__node_base_ptr)0x0;
    local_208 = (__buckets_ptr)0x0;
    LogicalProjection::LogicalProjection
              (this_03,table_index,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)local_1f8);
    local_170._M_dataplus._M_p = (pointer)this_03;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_1f8);
    pLVar15 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
              ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                            *)&local_170);
    ::std::
    vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
              ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                *)&(pLVar15->super_LogicalOperator).children,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)local_118);
    _Var4._M_p = local_170._M_dataplus._M_p;
    local_170._M_dataplus._M_p = (pointer)0x0;
    _Var3._M_head_impl =
         (local_150->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (local_150->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (LogicalOperator *)_Var4._M_p;
    if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)((long)(_Var3._M_head_impl)->_vptr_LogicalOperator + 8))();
    }
    if ((long *)local_170._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_170._M_dataplus._M_p + 8))();
    }
    if ((_Hash_node_base *)local_118._0_8_ != (_Hash_node_base *)0x0) {
      (*(code *)(*(_Hash_node_base **)local_118._0_8_)[1]._M_nxt)();
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_238);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_68);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&local_218);
    if ((element_type *)local_258._24_8_ != (element_type *)0x0) {
      (**(code **)((long)(((enable_shared_from_this<duckdb::Binder> *)local_258._24_8_)->
                         __weak_this_).internal.
                         super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8))()
      ;
    }
    if ((element_type *)local_258._0_8_ != (element_type *)0x0) {
      (*(code *)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&(((((enable_shared_from_this<duckdb::Binder> *)local_258._0_8_)->
                          __weak_this_).internal.
                          super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        super_enable_shared_from_this<duckdb::Binder>).__weak_this_ + 8))->_M_pi)();
    }
  }
  return;
}

Assistant:

void Binder::BindVacuumTable(LogicalVacuum &vacuum, unique_ptr<LogicalOperator> &root) {
	auto &info = vacuum.GetInfo();
	if (!info.has_table) {
		return;
	}

	D_ASSERT(vacuum.column_id_map.empty());
	auto bound_table = Bind(*info.ref);
	if (bound_table->type != TableReferenceType::BASE_TABLE) {
		throw InvalidInputException("can only vacuum or analyze base tables");
	}
	auto ref = unique_ptr_cast<BoundTableRef, BoundBaseTableRef>(std::move(bound_table));
	auto &table = ref->table;
	vacuum.SetTable(table);

	vector<unique_ptr<Expression>> select_list;
	auto &columns = info.columns;
	if (columns.empty()) {
		// Empty means ALL columns should be vacuumed/analyzed
		for (auto &col : table.GetColumns().Physical()) {
			columns.push_back(col.GetName());
		}
	}

	case_insensitive_set_t column_name_set;
	vector<string> non_generated_column_names;
	for (auto &col_name : columns) {
		if (column_name_set.count(col_name) > 0) {
			throw BinderException("cannot vacuum or analyze the same column twice, i.e., there is a duplicate entry in "
			                      "the list of column names");
		}
		column_name_set.insert(col_name);
		if (!table.ColumnExists(col_name)) {
			throw BinderException("Column with name \"%s\" does not exist", col_name);
		}
		auto &col = table.GetColumn(col_name);
		// ignore generated column
		if (col.Generated()) {
			throw BinderException(
			    "cannot vacuum or analyze generated column \"%s\" - specify non-generated columns to vacuum or analyze",
			    col.GetName());
		}
		non_generated_column_names.push_back(col_name);
		ColumnRefExpression colref(col_name, table.name);
		auto result = bind_context.BindColumn(colref, 0);
		if (result.HasError()) {
			result.error.Throw();
		}
		select_list.push_back(std::move(result.expression));
	}
	info.columns = std::move(non_generated_column_names);

	auto table_scan = CreatePlan(*ref);
	D_ASSERT(table_scan->type == LogicalOperatorType::LOGICAL_GET);

	auto &get = table_scan->Cast<LogicalGet>();

	auto &column_ids = get.GetColumnIds();
	D_ASSERT(select_list.size() == column_ids.size());
	D_ASSERT(info.columns.size() == column_ids.size());
	for (idx_t i = 0; i < column_ids.size(); i++) {
		vacuum.column_id_map[i] = table.GetColumns().LogicalToPhysical(column_ids[i].ToLogical()).index;
	}

	auto projection = make_uniq<LogicalProjection>(GenerateTableIndex(), std::move(select_list));
	projection->children.push_back(std::move(table_scan));

	root = std::move(projection);
}